

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O1

void __thiscall NoteOffQueue::Heapify(NoteOffQueue *this)

{
  uint uVar1;
  AutoNoteOff *pAVar2;
  AutoNoteOff AVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = 0;
  while( true ) {
    uVar7 = uVar5 * 2 + 1;
    uVar1 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Count;
    uVar4 = uVar5;
    if ((uVar7 < uVar1) &&
       (pAVar2 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array, uVar4 = uVar7,
       pAVar2[uVar5].Delay <= pAVar2[uVar7].Delay)) {
      uVar4 = uVar5;
    }
    uVar7 = uVar5 * 2 + 2;
    uVar6 = uVar4;
    if ((uVar7 < uVar1) &&
       (pAVar2 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array, uVar6 = uVar7,
       pAVar2[uVar4].Delay <= pAVar2[uVar7].Delay)) {
      uVar6 = uVar4;
    }
    if (uVar6 == uVar5) break;
    pAVar2 = (this->super_TArray<AutoNoteOff,_AutoNoteOff>).Array;
    AVar3 = pAVar2[uVar5];
    pAVar2[uVar5] = pAVar2[uVar6];
    pAVar2[uVar6] = AVar3;
    uVar5 = uVar6;
  }
  return;
}

Assistant:

void NoteOffQueue::Heapify()
{
	unsigned int i = 0;
	for (;;)
	{
		unsigned int l = Left(i);
		unsigned int r = Right(i);
		unsigned int smallest = i;
		if (l < Size() && (*this)[l].Delay < (*this)[i].Delay)
		{
			smallest = l;
		}
		if (r < Size() && (*this)[r].Delay < (*this)[smallest].Delay)
		{
			smallest = r;
		}
		if (smallest == i)
		{
			break;
		}
		swapvalues((*this)[i], (*this)[smallest]);
		i = smallest;
	}
}